

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec.cpp
# Opt level: O1

MPP_RET mpp_dec_proc_cfg(MppDecImpl *dec,MpiCmd cmd,void *param)

{
  MPP_RET MVar1;
  MppFrameFormat MVar2;
  uint uVar3;
  MppFrameFormat MVar4;
  RK_U32 RVar5;
  RK_U32 RVar6;
  RK_U32 RVar7;
  RK_U32 RVar8;
  char *fmt;
  MPP_RET MVar9;
  RK_S32 *p;
  
  mpp_parser_control(dec->parser,cmd,param);
  MVar1 = mpp_hal_control(dec->hal,cmd,param);
  if (MVar1 == MPP_OK) {
    MVar9 = MPP_OK;
    MVar1 = MVar9;
    if ((int)cmd < 0x310101) {
      MVar1 = MPP_OK;
      switch(cmd) {
      case MPP_DEC_SET_FRAME_INFO:
        MVar4 = mpp_frame_get_fmt(param);
        (dec->cfg).base.out_fmt = MVar4;
        MVar1 = MPP_OK;
        _mpp_log_l(4,"mpp_dec","found MPP_DEC_SET_FRAME_INFO fmt %x\n","mpp_dec_proc_cfg",
                   (ulong)MVar4);
        mpp_slots_set_prop(dec->frame_slots,SLOTS_FRAME_INFO,param);
        RVar5 = mpp_frame_get_width(param);
        RVar6 = mpp_frame_get_height(param);
        RVar7 = mpp_frame_get_hor_stride(param);
        RVar8 = mpp_frame_get_ver_stride(param);
        _mpp_log_l(4,"mpp_dec","setting default w %4d h %4d h_str %4d v_str %4d\n",(char *)0x0,
                   (ulong)RVar5,(ulong)RVar6,(ulong)RVar7,(ulong)RVar8);
        break;
      case MPP_DEC_SET_INFO_CHANGE_READY:
        MVar1 = mpp_buf_slot_ready(dec->frame_slots);
        return MVar1;
      case MPP_DEC_SET_PRESENT_TIME_ORDER:
      case MPP_DEC_SET_PARSER_SPLIT_MODE:
      case MPP_DEC_SET_PARSER_FAST_MODE:
      case MPP_DEC_SET_OUTPUT_FORMAT:
      case MPP_DEC_SET_DISABLE_ERROR:
      case MPP_DEC_SET_IMMEDIATE_OUT:
      case MPP_DEC_SET_ENABLE_DEINTERLACE:
      case MPP_DEC_SET_ENABLE_FAST_PLAY:
      case MPP_DEC_SET_ENABLE_MVC:
      case MPP_DEC_SET_DISABLE_DPB_CHECK:
      case MPP_DEC_SET_DIS_ERR_CLR_MARK:
        MVar1 = mpp_dec_set_cfg_by_cmd(&dec->cfg,cmd,param);
        mpp_dec_update_cfg(dec);
        MVar4 = (dec->cfg).base.out_fmt;
        if ((MVar4 & 0xf00000) != MPP_FMT_YUV420SP) {
          MVar2 = MVar4 & 0xff0fffff;
          if ((dec->hw_info != (MppDecHwCap *)0x0) && ((dec->hw_info->field_0x5 & 0xf) != 0)) {
            MVar2 = MVar4;
          }
          (dec->cfg).base.out_fmt = MVar2;
        }
        (dec->cfg).base.change = 0;
        break;
      case MPP_DEC_GET_VPUMEM_USED_COUNT:
        uVar3 = mpp_slots_get_used_count(dec->frame_slots);
        *(uint *)param = uVar3;
        MVar1 = MVar9;
        if (((byte)mpp_dec_debug & 1) != 0) {
          MVar1 = MPP_OK;
          _mpp_log_l(4,"mpp_dec","used count %d\n","mpp_dec_proc_cfg",(ulong)uVar3);
        }
      }
    }
    else if (cmd == MPP_DEC_QUERY) {
      uVar3 = *param;
      if (((byte)mpp_dec_debug & 1) != 0) {
        _mpp_log_l(4,"mpp_dec","query %x\n","mpp_dec_proc_cfg",(ulong)uVar3);
      }
      if ((uVar3 & 1) != 0) {
        *(RK_U32 *)((long)param + 4) = dec->parser_status_flag;
      }
      if ((uVar3 & 2) != 0) {
        *(RK_U32 *)((long)param + 8) = dec->parser_wait_flag;
      }
      if ((uVar3 & 4) != 0) {
        *(undefined4 *)((long)param + 0xc) = 0;
      }
      if ((uVar3 & 8) != 0) {
        *(undefined4 *)((long)param + 0x10) = 0;
      }
      if ((uVar3 & 0x10) != 0) {
        *(RK_U32 *)((long)param + 0x14) = dec->dec_in_pkt_count;
      }
      if ((uVar3 & 0x20) != 0) {
        *(RK_U32 *)((long)param + 0x18) = dec->dec_hw_run_count;
      }
      if ((uVar3 & 0x40) != 0) {
        *(RK_U32 *)((long)param + 0x1c) = dec->dec_out_frame_count;
      }
    }
    else {
      if (cmd == MPP_DEC_SET_CFG) {
        if (param != (void *)0x0) {
          mpp_dec_set_cfg(&dec->cfg,(MppDecCfgSet *)((long)param + 8));
          mpp_dec_update_cfg(dec);
          MVar4 = (dec->cfg).base.out_fmt;
          if ((MVar4 & 0xf00000) != MPP_FMT_YUV420SP) {
            MVar2 = MVar4 & 0xff0fffff;
            if ((dec->hw_info != (MppDecHwCap *)0x0) && ((dec->hw_info->field_0x5 & 0xf) != 0)) {
              MVar2 = MVar4;
            }
            (dec->cfg).base.out_fmt = MVar2;
          }
        }
        if (((byte)mpp_dec_debug & 1) == 0) {
          return MPP_OK;
        }
        fmt = "set dec cfg\n";
      }
      else {
        if (cmd != MPP_DEC_GET_CFG) {
          return MPP_OK;
        }
        if (param != (void *)0x0) {
          memcpy((void *)((long)param + 8),&dec->cfg,0xa0);
        }
        if (((byte)mpp_dec_debug & 1) == 0) {
          return MPP_OK;
        }
        fmt = "get dec cfg\n";
      }
      _mpp_log_l(4,"mpp_dec",fmt,"mpp_dec_proc_cfg");
      MVar1 = MPP_OK;
    }
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_dec_proc_cfg(MppDecImpl *dec, MpiCmd cmd, void *param)
{
    MPP_RET ret = MPP_OK;

    mpp_parser_control(dec->parser, cmd, param);

    ret = mpp_hal_control(dec->hal, cmd, param);

    if (ret)
        goto RET;

    switch (cmd) {
    case MPP_DEC_SET_FRAME_INFO : {
        MppFrame frame = (MppFrame)param;

        /* update output frame format */
        dec->cfg.base.out_fmt = mpp_frame_get_fmt(frame);
        mpp_log_f("found MPP_DEC_SET_FRAME_INFO fmt %x\n", dec->cfg.base.out_fmt);

        mpp_slots_set_prop(dec->frame_slots, SLOTS_FRAME_INFO, frame);

        mpp_log("setting default w %4d h %4d h_str %4d v_str %4d\n",
                mpp_frame_get_width(frame),
                mpp_frame_get_height(frame),
                mpp_frame_get_hor_stride(frame),
                mpp_frame_get_ver_stride(frame));

    } break;
    case MPP_DEC_SET_INFO_CHANGE_READY: {
        ret = mpp_buf_slot_ready(dec->frame_slots);
    } break;
    case MPP_DEC_GET_VPUMEM_USED_COUNT: {
        RK_S32 *p = (RK_S32 *)param;
        *p = mpp_slots_get_used_count(dec->frame_slots);
        dec_dbg_func("used count %d\n", *p);
    } break;
    case MPP_DEC_SET_PRESENT_TIME_ORDER :
    case MPP_DEC_SET_PARSER_SPLIT_MODE :
    case MPP_DEC_SET_PARSER_FAST_MODE :
    case MPP_DEC_SET_IMMEDIATE_OUT :
    case MPP_DEC_SET_OUTPUT_FORMAT :
    case MPP_DEC_SET_DISABLE_ERROR :
    case MPP_DEC_SET_DIS_ERR_CLR_MARK :
    case MPP_DEC_SET_ENABLE_DEINTERLACE :
    case MPP_DEC_SET_ENABLE_FAST_PLAY :
    case MPP_DEC_SET_ENABLE_MVC :
    case MPP_DEC_SET_DISABLE_DPB_CHECK: {
        ret = mpp_dec_set_cfg_by_cmd(&dec->cfg, cmd, param);
        mpp_dec_update_cfg(dec);
        mpp_dec_check_fbc_cap(dec);
        dec->cfg.base.change = 0;
    } break;
    case MPP_DEC_QUERY: {
        MppDecQueryCfg *query = (MppDecQueryCfg *)param;
        RK_U32 flag = query->query_flag;

        dec_dbg_func("query %x\n", flag);

        if (flag & MPP_DEC_QUERY_STATUS)
            query->rt_status = dec->parser_status_flag;

        if (flag & MPP_DEC_QUERY_WAIT)
            query->rt_wait = dec->parser_wait_flag;

        if (flag & MPP_DEC_QUERY_FPS)
            query->rt_fps = 0;

        if (flag & MPP_DEC_QUERY_BPS)
            query->rt_bps = 0;

        if (flag & MPP_DEC_QUERY_DEC_IN_PKT)
            query->dec_in_pkt_cnt = dec->dec_in_pkt_count;

        if (flag & MPP_DEC_QUERY_DEC_WORK)
            query->dec_hw_run_cnt = dec->dec_hw_run_count;

        if (flag & MPP_DEC_QUERY_DEC_OUT_FRM)
            query->dec_out_frm_cnt = dec->dec_out_frame_count;
    } break;
    case MPP_DEC_SET_CFG: {
        MppDecCfgImpl *dec_cfg = (MppDecCfgImpl *)param;

        if (dec_cfg) {
            mpp_dec_set_cfg(&dec->cfg, &dec_cfg->cfg);
            mpp_dec_update_cfg(dec);
            mpp_dec_check_fbc_cap(dec);
        }

        dec_dbg_func("set dec cfg\n");
    } break;
    case MPP_DEC_GET_CFG: {
        MppDecCfgImpl *dec_cfg = (MppDecCfgImpl *)param;

        if (dec_cfg)
            memcpy(&dec_cfg->cfg, &dec->cfg, sizeof(dec->cfg));

        dec_dbg_func("get dec cfg\n");
    } break;
    default : {
    } break;
    }

RET:
    return ret;
}